

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCallIndirect
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          CallIndirect *curr)

{
  char **this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  Name breakTo;
  bool bVar3;
  byte bVar4;
  ExpressionRunner<wasm::ModuleRunner> *pEVar5;
  ExternalInterface *pEVar6;
  ModuleRunner *pMVar7;
  Address local_1e0;
  ModuleRunner *local_1d8;
  size_t sStack_1d0;
  Literals local_1c8;
  undefined1 local_189;
  size_t local_188;
  char *pcStack_180;
  uintptr_t local_178;
  Type local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  Address local_160;
  ModuleRunner *local_158;
  size_t sStack_150;
  undefined1 local_140 [8];
  Literal funcref;
  undefined1 local_118 [8];
  TableInstanceInfo info;
  uint64_t index;
  Flow target;
  undefined1 local_a0 [8];
  Flow flow;
  Literals arguments;
  CallIndirect *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Flow *ret;
  
  this_00 = &flow.breakTo.super_IString.str._M_str;
  Literals::Literals((Literals *)this_00);
  pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_a0,pEVar5,(ExpressionList *)(curr + 0x18),(Literals *)this_00);
  bVar3 = Flow::breaking((Flow *)local_a0);
  if (bVar3) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_a0);
    target.breakTo.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    pEVar5 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit((Flow *)&index,pEVar5,*(Expression **)(curr + 0x38))
    ;
    bVar3 = Flow::breaking((Flow *)&index);
    if (bVar3) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&index);
      target.breakTo.super_IString.str._M_str._0_4_ = 1;
    }
    else {
      Flow::getSingleValue((Flow *)&index);
      info.name.super_IString.str._M_str = (char *)::wasm::Literal::getUnsigned();
      funcref.type.id = *(uintptr_t *)(curr + 0x40);
      getTableInstanceInfo((TableInstanceInfo *)local_118,this,(Name)*(string_view *)(curr + 0x40));
      if (((byte)curr[0x50] & 1) == 0) {
        local_189 = 0;
        pEVar6 = TableInstanceInfo::interface((TableInstanceInfo *)local_118);
        local_1d8 = info.instance;
        sStack_1d0 = info.name.super_IString.str._M_len;
        Address::Address(&local_1e0,(uint64_t)info.name.super_IString.str._M_str);
        uVar1 = *(undefined8 *)(curr + 0x10);
        uVar2 = *(undefined8 *)(curr + 8);
        pMVar7 = self(this);
        (*pEVar6->_vptr_ExternalInterface[5])
                  (&local_1c8,pEVar6,local_1d8,sStack_1d0,local_1e0.addr,uVar1,
                   &flow.breakTo.super_IString.str._M_str,uVar2,pMVar7);
        Flow::Flow(__return_storage_ptr__,&local_1c8);
        Literals::~Literals(&local_1c8);
        target.breakTo.super_IString.str._M_str._0_4_ = 1;
        local_189 = 1;
      }
      else {
        pEVar6 = TableInstanceInfo::interface((TableInstanceInfo *)local_118);
        local_158 = info.instance;
        sStack_150 = info.name.super_IString.str._M_len;
        Address::Address(&local_160,(uint64_t)info.name.super_IString.str._M_str);
        (*pEVar6->_vptr_ExternalInterface[0x1d])
                  (local_140,pEVar6,local_158,sStack_150,local_160.addr);
        local_168._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             funcref.field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_178 = *(uintptr_t *)(curr + 0x10);
        Type::Type(&local_170,(HeapType)local_178,NonNullable,Inexact);
        bVar4 = ::wasm::Type::isSubType((Type)local_168._M_pi,local_170);
        if ((bVar4 & 1) == 0) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"cast failure in call_indirect");
        }
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str,
                   (Literal *)local_140);
        local_188 = RETURN_CALL_FLOW;
        pcStack_180 = _bitmaskI8x16;
        breakTo.super_IString.str._M_str = _bitmaskI8x16;
        breakTo.super_IString.str._M_len = RETURN_CALL_FLOW;
        Flow::Flow(__return_storage_ptr__,breakTo,(Literals *)&flow.breakTo.super_IString.str._M_str
                  );
        target.breakTo.super_IString.str._M_str._0_4_ = 1;
        ::wasm::Literal::~Literal((Literal *)local_140);
      }
    }
    Flow::~Flow((Flow *)&index);
  }
  Flow::~Flow((Flow *)local_a0);
  Literals::~Literals((Literals *)&flow.breakTo.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCallIndirect(CallIndirect* curr) {
    NOTE_ENTER("CallIndirect");
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    Flow target = self()->visit(curr->target);
    if (target.breaking()) {
      return target;
    }

    auto index = target.getSingleValue().getUnsigned();
    auto info = getTableInstanceInfo(curr->table);

    if (curr->isReturn) {
      // Return calls are represented by their arguments followed by a reference
      // to the function to be called.
      auto funcref = info.interface()->tableLoad(info.name, index);
      if (!Type::isSubType(funcref.type, Type(curr->heapType, NonNullable))) {
        trap("cast failure in call_indirect");
      }
      arguments.push_back(funcref);
      return Flow(RETURN_CALL_FLOW, std::move(arguments));
    }

    Flow ret = info.interface()->callTable(
      info.name, index, curr->heapType, arguments, curr->type, *self());
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    return ret;
  }